

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O1

void __thiscall
TTD::ExecutionInfoManager::AddCurrentLocationDuringScan
          (ExecutionInfoManager *this,int64 topLevelEventTime)

{
  SingleCallCounter *callFrame;
  undefined1 local_58 [8];
  TTDebuggerSourceLocation current;
  
  TTDebuggerSourceLocation::TTDebuggerSourceLocation((TTDebuggerSourceLocation *)local_58);
  callFrame = JsUtil::
              List<TTD::SingleCallCounter,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Last(&this->m_callStack);
  TTDebuggerSourceLocation::SetLocationFromFrame
            ((TTDebuggerSourceLocation *)local_58,topLevelEventTime,callFrame);
  if ((((((this->m_activeTTDBP).m_sourceScriptLogId != 0) &&
        ((this->m_activeTTDBP).m_topLevelBodyId == (uint32)current.m_ltime)) &&
       ((this->m_activeTTDBP).m_line == current.m_functionLine)) &&
      (((this->m_activeTTDBP).m_column == current.m_functionColumn &&
       ((this->m_activeTTDBP).m_etime == current.m_bpId)))) &&
     (((this->m_activeTTDBP).m_ftime == current.m_etime &&
      ((this->m_activeTTDBP).m_ltime == current.m_ftime)))) {
    this->m_hitContinueSearchBP = true;
  }
  if ((this->m_hitContinueSearchBP == false) &&
     (((this->m_shouldRemoveWhenDone != true ||
       ((this->m_activeTTDBP).m_topLevelBodyId != (uint32)current.m_ltime)) ||
      (((this->m_activeTTDBP).m_line != current.m_functionLine ||
       ((this->m_activeTTDBP).m_column != current.m_functionColumn)))))) {
    (this->m_continueBreakPoint).m_sourceScriptLogId = (TTD_LOG_PTR_ID)local_58;
    (this->m_continueBreakPoint).m_bpId = current.m_sourceScriptLogId;
    (this->m_continueBreakPoint).m_etime = current.m_bpId;
    (this->m_continueBreakPoint).m_ftime = current.m_etime;
    (this->m_continueBreakPoint).m_ltime = current.m_ftime;
    (this->m_continueBreakPoint).m_topLevelBodyId = (uint32)current.m_ltime;
    (this->m_continueBreakPoint).m_functionLine = current.m_ltime._4_4_;
    (this->m_continueBreakPoint).m_functionColumn = current.m_topLevelBodyId;
    (this->m_continueBreakPoint).m_line = current.m_functionLine;
    (this->m_continueBreakPoint).m_column = current.m_functionColumn;
  }
  TTDebuggerSourceLocation::~TTDebuggerSourceLocation((TTDebuggerSourceLocation *)local_58);
  return;
}

Assistant:

void ExecutionInfoManager::AddCurrentLocationDuringScan(int64 topLevelEventTime)
    {
        TTDebuggerSourceLocation current;
        current.SetLocationFromFrame(topLevelEventTime, this->m_callStack.Last());

        if(this->m_activeTTDBP.HasValue() && TTDebuggerSourceLocation::AreSameLocations(this->m_activeTTDBP, current))
        {
            this->m_hitContinueSearchBP = true;
        }

        if(!this->m_hitContinueSearchBP && !this->IsLocationActiveBPAndNotExplicitBP(current))
        {
            this->m_continueBreakPoint.SetLocationCopy(current);
        }
    }